

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::detail::match_t::~match_t(match_t *this)

{
  match_t *this_local;
  
  scoped_dfs_traverser::~scoped_dfs_traverser(&this->pos_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

match_t(arg_string s, scoped_dfs_traverser p):
        str_{std::move(s)}, pos_{std::move(p)}
    {}